

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::SimpleTypeHandler<2UL>::GetSetter
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,JavascriptString *propertyNameString
          ,Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  long lVar6;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar7;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> propertyName;
  
  pcVar4 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(pcVar4,cVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x27c,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pcVar4 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit(local_38);
  local_38 = (undefined1  [8])pcVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_38);
  if (0 < this->propertyCount) {
    paVar7 = &this->descriptors[0].field_1;
    lVar6 = 0;
    propertyName.string.ptr._0_4_ = cVar3;
    do {
      bVar2 = PropertyRecord::Equals
                        ((((Type *)(paVar7 + -1))->Id).ptr,(CharacterBuffer<char16_t> *)local_38);
      if (bVar2) {
        if ((paVar7->Attributes & 8) != 0) {
          return None;
        }
        return paVar7->Attributes & Writable | Data;
      }
      lVar6 = lVar6 + 1;
      paVar7 = paVar7 + 2;
    } while (lVar6 < this->propertyCount);
  }
  return None;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->Equals(propertyName))
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return None;
                }
                return (descriptors[i].Attributes & PropertyWritable) ? WritableData : Data;
            }
        }

        return None;
    }